

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O2

bool __thiscall
nlohmann::detail::
iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::operator==(iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             *this,iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                   *other)

{
  value_t vVar1;
  invalid_iterator *__return_storage_ptr__;
  bool bVar2;
  allocator<char> local_39;
  string local_38;
  
  if (this->m_object == other->m_object) {
    vVar1 = this->m_object->m_type;
    if (vVar1 == array) {
      bVar2 = (this->m_it).array_iterator._M_current == (other->m_it).array_iterator._M_current;
    }
    else if (vVar1 == object) {
      bVar2 = (this->m_it).object_iterator._M_node == (other->m_it).object_iterator._M_node;
    }
    else {
      bVar2 = (this->m_it).primitive_iterator.m_it == (other->m_it).primitive_iterator.m_it;
    }
    return bVar2;
  }
  __return_storage_ptr__ = (invalid_iterator *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"cannot compare iterators of different containers",&local_39);
  invalid_iterator::create(__return_storage_ptr__,0xd4,&local_38);
  __cxa_throw(__return_storage_ptr__,&invalid_iterator::typeinfo,exception::~exception);
}

Assistant:

bool operator==(const iter_impl& other) const
{
// if objects are not the same, the comparison is undefined
if (JSON_UNLIKELY(m_object != other.m_object))
{
JSON_THROW(invalid_iterator::create(212, "cannot compare iterators of different containers"));
}

assert(m_object != nullptr);

switch (m_object->m_type)
{
case value_t::object:
return (m_it.object_iterator == other.m_it.object_iterator);

case value_t::array:
return (m_it.array_iterator == other.m_it.array_iterator);

default:
return (m_it.primitive_iterator == other.m_it.primitive_iterator);
}
}